

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollwrap.c
# Opt level: O2

int pollwrap_get_fd_rwx(pollwrapper *pw,int fd)

{
  ulong in_RAX;
  byte bVar1;
  uint uVar2;
  int revents;
  int events;
  undefined8 local_18;
  
  local_18 = in_RAX;
  pollwrap_get_fd_events_revents(pw,fd,(int *)((long)&local_18 + 4),(int *)&local_18);
  bVar1 = (local_18 & 0xd9) != 0 & (byte)(local_18 >> 0x20);
  uVar2 = bVar1 + 2;
  if ((local_18 & 0x30c) == 0) {
    uVar2 = (uint)bVar1;
  }
  if ((local_18 & 0x400000000) == 0) {
    uVar2 = (uint)bVar1;
  }
  return uVar2 + ((uint)local_18 & local_18._4_4_ & 2) * 2;
}

Assistant:

int pollwrap_get_fd_rwx(pollwrapper *pw, int fd)
{
    int events, revents;
    pollwrap_get_fd_events_revents(pw, fd, &events, &revents);
    int rwx = 0;
    if ((events & POLLIN) && (revents & SELECT_R_OUT))
        rwx |= SELECT_R;
    if ((events & POLLOUT) && (revents & SELECT_W_OUT))
        rwx |= SELECT_W;
    if ((events & POLLPRI) && (revents & SELECT_X_OUT))
        rwx |= SELECT_X;
    return rwx;
}